

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

bool booster::operator>(string_type *l,sub_match<const_char_*> *r)

{
  int iVar1;
  string_type local_30;
  
  sub_match<char_const*>::str_abi_cxx11_(&local_30,r);
  iVar1 = std::__cxx11::string::compare((string *)l);
  std::__cxx11::string::~string((string *)&local_30);
  return 0 < iVar1;
}

Assistant:

bool operator>(
		typename sub_match<Iterator>::string_type const &l,
		sub_match<Iterator> const &r) 
	{ return l.compare(r) > 0; }